

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fp_stress.c
# Opt level: O3

void entry(void *args0)

{
  int j;
  uint uVar1;
  int iVar2;
  double tmp_a14106;
  double dVar3;
  double dVar4;
  double tmp_a15107_1;
  double dVar5;
  double dVar6;
  double tmp_a17110_1;
  double dVar7;
  double tmp_a3110;
  double dVar8;
  double dVar9;
  double tmp_a3104;
  double dVar10;
  double dVar11;
  double tmp_a2103;
  double dVar12;
  double dVar13;
  double tmp_a10106;
  double dVar14;
  double tmp_a16110;
  double dVar15;
  double tmp_a18111;
  double dVar16;
  double tmp_a11107;
  double dVar17;
  double tmp_a14106_1;
  double local_b0;
  double local_90;
  double local_88;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  
  iVar2 = *(int *)((long)args0 + 0x14);
  dVar3 = (double)iVar2;
  dVar16 = A[0] + dVar3;
  local_60 = (double)(iVar2 * 3);
  local_78 = A[1] + local_60;
  dVar12 = A[2] - dVar3;
  dVar10 = A[3] - local_60;
  local_88 = A[4] + dVar3;
  dVar7 = A[5] + local_60;
  local_50 = A[6] - dVar3;
  dVar5 = A[7] - local_60;
  dVar13 = A[8] + dVar3;
  dVar14 = A[10] - dVar3;
  local_70 = A[0xc] + dVar3;
  local_58 = A[0xe] - dVar3;
  dVar15 = A[0x10] + dVar3;
  dVar3 = A[0x12] - dVar3;
  dVar8 = A[9] + local_60;
  dVar17 = A[0xb] - local_60;
  local_90 = A[0xd] + local_60;
  local_b0 = A[0xf] - local_60;
  local_68 = A[0x11] + local_60;
  local_60 = A[0x13] - local_60;
  if (0 < *(int *)((long)args0 + 0x10)) {
    iVar2 = 0;
    do {
      uVar1 = 0;
      do {
        if ((uVar1 & 1) == 0) {
          dVar8 = local_58 * -31.0 + local_70 * dVar14 + 1.0;
          dVar4 = (dVar14 * dVar8 - (local_58 * local_70 + local_58 * local_70)) + 1.0;
          dVar11 = dVar4 * dVar4 + dVar8 * dVar8;
          dVar13 = dVar8;
          dVar14 = dVar4;
          while (24.0 < dVar11) {
            dVar9 = (dVar14 + dVar13) * 0.058823529411764705;
            dVar14 = (dVar13 - dVar14) * 0.05555555555555555;
            dVar13 = dVar9;
            dVar11 = dVar14 * dVar14 + dVar9 * dVar9;
          }
          local_70 = local_58 * local_58 + dVar8 * 3.0 + -1.0;
          local_58 = ((dVar8 + dVar4) - local_70) + local_58 * -11.0 + -1.0;
          dVar8 = local_58 * local_58;
          dVar4 = local_70 * local_70 + dVar8;
          while (27.0 < dVar4) {
            dVar11 = (local_58 + local_70) * 0.058823529411764705;
            local_58 = (local_70 - local_58) * 0.05555555555555555;
            dVar8 = local_58 * local_58;
            local_70 = dVar11;
            dVar4 = dVar11 * dVar11 + dVar8;
          }
          dVar8 = dVar13 * dVar13 + dVar8;
          while (29.0 < dVar8) {
            dVar4 = (local_58 + dVar13) * 0.058823529411764705;
            local_58 = (dVar13 - local_58) * 0.05555555555555555;
            dVar13 = dVar4;
            dVar8 = local_58 * local_58 + dVar4 * dVar4;
          }
          dVar8 = local_70 * local_70 + dVar14 * dVar14;
          while (31.0 < dVar8) {
            dVar4 = (local_70 + dVar14) * 0.058823529411764705;
            local_70 = (dVar14 - local_70) * 0.05555555555555555;
            dVar14 = dVar4;
            dVar8 = local_70 * local_70 + dVar4 * dVar4;
          }
          dVar4 = local_b0 * -31.0 + local_90 * dVar17 + 1.0;
          dVar11 = (dVar17 * dVar4 - (local_b0 * local_90 + local_b0 * local_90)) + 1.0;
          dVar9 = dVar11 * dVar11 + dVar4 * dVar4;
          dVar8 = dVar4;
          dVar17 = dVar11;
          while (24.0 < dVar9) {
            dVar6 = (dVar17 + dVar8) * 0.058823529411764705;
            dVar17 = (dVar8 - dVar17) * 0.05555555555555555;
            dVar8 = dVar6;
            dVar9 = dVar17 * dVar17 + dVar6 * dVar6;
          }
          local_90 = local_b0 * local_b0 + dVar4 * 3.0 + -1.0;
          local_b0 = ((dVar4 + dVar11) - local_90) + local_b0 * -11.0 + -1.0;
          dVar4 = local_b0 * local_b0;
          dVar11 = local_90 * local_90 + dVar4;
          while (27.0 < dVar11) {
            dVar9 = (local_b0 + local_90) * 0.058823529411764705;
            local_b0 = (local_90 - local_b0) * 0.05555555555555555;
            dVar4 = local_b0 * local_b0;
            local_90 = dVar9;
            dVar11 = dVar9 * dVar9 + dVar4;
          }
          dVar4 = dVar8 * dVar8 + dVar4;
          while (29.0 < dVar4) {
            dVar11 = (local_b0 + dVar8) * 0.058823529411764705;
            local_b0 = (dVar8 - local_b0) * 0.05555555555555555;
            dVar8 = dVar11;
            dVar4 = local_b0 * local_b0 + dVar11 * dVar11;
          }
          dVar4 = local_90 * local_90 + dVar17 * dVar17;
          while (31.0 < dVar4) {
            dVar11 = (local_90 + dVar17) * 0.058823529411764705;
            local_90 = (dVar17 - local_90) * 0.05555555555555555;
            dVar17 = dVar11;
            dVar4 = local_90 * local_90 + dVar11 * dVar11;
          }
        }
        else {
          dVar4 = local_50 * -31.0 + local_88 * dVar12 + 1.0;
          dVar11 = (dVar12 * dVar4 - (local_50 * local_88 + local_50 * local_88)) + 1.0;
          dVar9 = dVar11 * dVar11 + dVar4 * dVar4;
          dVar16 = dVar4;
          dVar12 = dVar11;
          while (24.0 < dVar9) {
            dVar6 = (dVar12 + dVar16) * 0.058823529411764705;
            dVar12 = (dVar16 - dVar12) * 0.05555555555555555;
            dVar16 = dVar6;
            dVar9 = dVar12 * dVar12 + dVar6 * dVar6;
          }
          local_88 = local_50 * local_50 + dVar4 * 3.0 + -1.0;
          local_50 = ((dVar4 + dVar11) - local_88) + local_50 * -11.0 + -1.0;
          dVar4 = local_50 * local_50;
          dVar11 = local_88 * local_88 + dVar4;
          while (27.0 < dVar11) {
            dVar9 = (local_50 + local_88) * 0.058823529411764705;
            local_50 = (local_88 - local_50) * 0.05555555555555555;
            dVar4 = local_50 * local_50;
            local_88 = dVar9;
            dVar11 = dVar9 * dVar9 + dVar4;
          }
          dVar4 = dVar16 * dVar16 + dVar4;
          while (29.0 < dVar4) {
            dVar11 = (local_50 + dVar16) * 0.058823529411764705;
            local_50 = (dVar16 - local_50) * 0.05555555555555555;
            dVar16 = dVar11;
            dVar4 = local_50 * local_50 + dVar11 * dVar11;
          }
          dVar4 = local_88 * local_88 + dVar12 * dVar12;
          while (31.0 < dVar4) {
            dVar11 = (local_88 + dVar12) * 0.058823529411764705;
            local_88 = (dVar12 - local_88) * 0.05555555555555555;
            dVar12 = dVar11;
            dVar4 = local_88 * local_88 + dVar11 * dVar11;
          }
          dVar4 = dVar5 * -31.0 + dVar7 * dVar10 + 1.0;
          dVar11 = (dVar10 * dVar4 - (dVar5 * dVar7 + dVar5 * dVar7)) + 1.0;
          dVar7 = dVar11 * dVar11 + dVar4 * dVar4;
          local_78 = dVar4;
          dVar10 = dVar11;
          while (24.0 < dVar7) {
            dVar9 = (dVar10 + local_78) * 0.058823529411764705;
            dVar10 = (local_78 - dVar10) * 0.05555555555555555;
            local_78 = dVar9;
            dVar7 = dVar10 * dVar10 + dVar9 * dVar9;
          }
          dVar7 = dVar5 * dVar5 + dVar4 * 3.0 + -1.0;
          dVar5 = ((dVar4 + dVar11) - dVar7) + dVar5 * -11.0 + -1.0;
          dVar4 = dVar5 * dVar5;
          dVar11 = dVar7 * dVar7 + dVar4;
          while (27.0 < dVar11) {
            dVar9 = (dVar5 + dVar7) * 0.058823529411764705;
            dVar5 = (dVar7 - dVar5) * 0.05555555555555555;
            dVar4 = dVar5 * dVar5;
            dVar7 = dVar9;
            dVar11 = dVar9 * dVar9 + dVar4;
          }
          dVar4 = local_78 * local_78 + dVar4;
          while (29.0 < dVar4) {
            dVar11 = (dVar5 + local_78) * 0.058823529411764705;
            dVar5 = (local_78 - dVar5) * 0.05555555555555555;
            local_78 = dVar11;
            dVar4 = dVar5 * dVar5 + dVar11 * dVar11;
          }
          dVar4 = dVar7 * dVar7 + dVar10 * dVar10;
          while (31.0 < dVar4) {
            dVar11 = (dVar7 + dVar10) * 0.058823529411764705;
            dVar7 = (dVar10 - dVar7) * 0.05555555555555555;
            dVar10 = dVar11;
            dVar4 = dVar7 * dVar7 + dVar11 * dVar11;
          }
        }
        if ((0.0 < dVar12) || (dVar17 < 0.0)) {
          dVar4 = local_68 * -31.0 + dVar15 * dVar10 + 1.0;
          dVar11 = (dVar15 * dVar4 - (dVar10 * local_68 + dVar10 * local_68)) + 1.0;
          dVar10 = dVar11 * dVar11 + dVar4 * dVar4;
          dVar16 = dVar4;
          dVar15 = dVar11;
          while (24.0 < dVar10) {
            dVar9 = (dVar15 + dVar16) * 0.058823529411764705;
            dVar15 = (dVar16 - dVar15) * 0.05555555555555555;
            dVar16 = dVar9;
            dVar10 = dVar15 * dVar15 + dVar9 * dVar9;
          }
          dVar10 = local_68 * local_68 + dVar4 * 3.0 + -1.0;
          local_68 = ((dVar4 + dVar11) - dVar10) + local_68 * -11.0 + -1.0;
          dVar4 = local_68 * local_68;
          dVar11 = dVar10 * dVar10 + dVar4;
          while (27.0 < dVar11) {
            dVar9 = (local_68 + dVar10) * 0.058823529411764705;
            local_68 = (dVar10 - local_68) * 0.05555555555555555;
            dVar4 = local_68 * local_68;
            dVar10 = dVar9;
            dVar11 = dVar9 * dVar9 + dVar4;
          }
          dVar4 = dVar16 * dVar16 + dVar4;
          while (29.0 < dVar4) {
            dVar11 = (local_68 + dVar16) * 0.058823529411764705;
            local_68 = (dVar16 - local_68) * 0.05555555555555555;
            dVar16 = dVar11;
            dVar4 = local_68 * local_68 + dVar11 * dVar11;
          }
          dVar4 = dVar10 * dVar10 + dVar15 * dVar15;
          while (31.0 < dVar4) {
            dVar11 = (dVar15 + dVar10) * 0.058823529411764705;
            dVar10 = (dVar15 - dVar10) * 0.05555555555555555;
            dVar15 = dVar11;
            dVar4 = dVar10 * dVar10 + dVar11 * dVar11;
          }
          dVar4 = local_60 * -31.0 + dVar3 * local_b0 + 1.0;
          dVar11 = (dVar3 * dVar4 - (local_b0 * local_60 + local_b0 * local_60)) + 1.0;
          dVar9 = dVar11 * dVar11 + dVar4 * dVar4;
          local_70 = dVar4;
          dVar3 = dVar11;
          while (24.0 < dVar9) {
            dVar6 = (dVar3 + local_70) * 0.058823529411764705;
            dVar3 = (local_70 - dVar3) * 0.05555555555555555;
            local_70 = dVar6;
            dVar9 = dVar3 * dVar3 + dVar6 * dVar6;
          }
          local_b0 = local_60 * local_60 + dVar4 * 3.0 + -1.0;
          local_60 = ((dVar4 + dVar11) - local_b0) + local_60 * -11.0 + -1.0;
          dVar4 = local_60 * local_60;
          dVar11 = local_b0 * local_b0 + dVar4;
          while (27.0 < dVar11) {
            dVar9 = (local_60 + local_b0) * 0.058823529411764705;
            local_60 = (local_b0 - local_60) * 0.05555555555555555;
            dVar4 = local_60 * local_60;
            local_b0 = dVar9;
            dVar11 = dVar9 * dVar9 + dVar4;
          }
          dVar4 = local_70 * local_70 + dVar4;
          while (29.0 < dVar4) {
            dVar11 = (local_60 + local_70) * 0.058823529411764705;
            local_60 = (local_70 - local_60) * 0.05555555555555555;
            local_70 = dVar11;
            dVar4 = local_60 * local_60 + dVar11 * dVar11;
          }
          dVar4 = local_b0 * local_b0 + dVar3 * dVar3;
          while (31.0 < dVar4) {
            dVar11 = (dVar3 + local_b0) * 0.058823529411764705;
            local_b0 = (dVar3 - local_b0) * 0.05555555555555555;
            dVar3 = dVar11;
            dVar4 = local_b0 * local_b0 + dVar11 * dVar11;
          }
        }
        uVar1 = uVar1 + 1;
      } while (uVar1 != 0x10);
      fiber_switch(*args0,*(Fiber **)((long)args0 + 8));
      if (((uint)(iVar2 * -0x3d70a3d7) >> 1 | (uint)((iVar2 * -0x3d70a3d7 & 1U) != 0) << 0x1f) <
          0x51eb852) {
        A[1] = local_78;
        A[4] = local_88;
        A[6] = local_50;
        A[0xc] = local_70;
        A[0xd] = local_90;
        A[0xe] = local_58;
        A[0xf] = local_b0;
        A[0x11] = local_68;
        A[0x13] = local_60;
        A[0] = dVar16;
        A[2] = dVar12;
        A[3] = dVar10;
        A[5] = dVar7;
        A[7] = dVar5;
        A[8] = dVar13;
        A[9] = dVar8;
        A[10] = dVar14;
        A[0xb] = dVar17;
        A[0x10] = dVar15;
        A[0x12] = dVar3;
        print(*(int *)((long)args0 + 0x14));
      }
      iVar2 = iVar2 + 1;
    } while (iVar2 < *(int *)((long)args0 + 0x10));
    iVar2 = *(int *)((long)args0 + 0x14);
  }
  A[6] = local_50;
  A[0xc] = local_70;
  A[0xd] = local_90;
  A[0xe] = local_58;
  A[0xf] = local_b0;
  A[0x11] = local_68;
  A[0x13] = local_60;
  A[0] = dVar16;
  A[1] = local_78;
  A[2] = dVar12;
  A[3] = dVar10;
  A[4] = local_88;
  A[5] = dVar7;
  A[7] = dVar5;
  A[8] = dVar13;
  A[9] = dVar8;
  A[10] = dVar14;
  A[0xb] = dVar17;
  A[0x10] = dVar15;
  A[0x12] = dVar3;
  print(iVar2);
  *(undefined1 *)((long)args0 + 0x18) = 1;
  fiber_switch(*args0,*(Fiber **)((long)args0 + 8));
  return;
}

Assistant:

static void
entry(void *args0)
{
    Args *args = (Args *) args0;
    DEF_A(0, 1, 2, 3);
    DEF_A(4, 5, 6, 7);
    DEF_A(8, 9, 10, 11);
    DEF_A(12, 13, 14, 15);
    DEF_A(16, 17, 18, 19);

    for (int i = 0; i < args->n; ++i) {
        for (int j = 0; j < 16; ++j) {
            if (j & 1) {
                MIX(0, 2, 4, 6);
                MIX(1, 3, 5, 7);
            } else {
                MIX(8, 10, 12, 14);
                MIX(9, 11, 13, 15);
            }
            if (a2 > 0 || a11 < 0) {
                MIX(0, 16, 3, 17);
                MIX(12, 18, 15, 19);
            }
        }
        fiber_switch(args->self, args->caller);
        if (i % 50 == 0) {
            STORE_ALL;
            print(args->id);
        }
    }

    STORE_ALL;
    print(args->id);
    args->done = true;
    fiber_switch(args->self, args->caller);
}